

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_socket_set_option(ENetSocket socket,ENetSocketOption option,int value)

{
  socklen_t __optlen;
  uint uVar1;
  int iVar2;
  timeval *__optval;
  int __optname;
  int value_local;
  timeval timeVal;
  
  iVar2 = -1;
  value_local = value;
  switch(option) {
  case ENET_SOCKOPT_NONBLOCK:
    uVar1 = fcntl(socket,3);
    iVar2 = fcntl(socket,4,(ulong)((uint)(value != 0) << 0xb | uVar1 & 0xfffff7ff));
    goto switchD_00106893_caseD_8;
  case ENET_SOCKOPT_BROADCAST:
    iVar2 = 1;
    __optname = 6;
    break;
  case ENET_SOCKOPT_RCVBUF:
    iVar2 = 1;
    __optname = 8;
    break;
  case ENET_SOCKOPT_SNDBUF:
    iVar2 = 1;
    __optname = 7;
    break;
  case ENET_SOCKOPT_REUSEADDR:
    iVar2 = 1;
    __optname = 2;
    break;
  case ENET_SOCKOPT_RCVTIMEO:
    __optname = 0x14;
    goto LAB_00106920;
  case ENET_SOCKOPT_SNDTIMEO:
    __optname = 0x15;
LAB_00106920:
    timeVal.tv_usec = (__suseconds_t)((value % 1000) * 1000);
    timeVal.tv_sec = (__time_t)(value / 1000);
    iVar2 = 1;
    __optval = &timeVal;
    __optlen = 0x10;
    goto LAB_00106947;
  default:
    goto switchD_00106893_caseD_8;
  case ENET_SOCKOPT_NODELAY:
    iVar2 = 6;
    __optname = 1;
    break;
  case ENET_SOCKOPT_IPV6_V6ONLY:
    iVar2 = 0x29;
    __optname = 0x1a;
  }
  __optval = (timeval *)&value_local;
  __optlen = 4;
LAB_00106947:
  iVar2 = setsockopt(socket,iVar2,__optname,__optval,__optlen);
switchD_00106893_caseD_8:
  return -(uint)(iVar2 == -1);
}

Assistant:

int enet_socket_set_option(ENetSocket socket, ENetSocketOption option, int value) {
	int result = -1;

	switch (option) {
	case ENET_SOCKOPT_NONBLOCK:
		result = fcntl(socket, F_SETFL, (value ? O_NONBLOCK : 0) | (fcntl(socket, F_GETFL) & ~O_NONBLOCK));

		break;

	case ENET_SOCKOPT_BROADCAST:
		result = setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_REUSEADDR:
		result = setsockopt(socket, SOL_SOCKET, SO_REUSEADDR, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_RCVBUF:
		result = setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_SNDBUF:
		result = setsockopt(socket, SOL_SOCKET, SO_SNDBUF, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_RCVTIMEO: {
		struct timeval timeVal;

		timeVal.tv_sec = value / 1000;
		timeVal.tv_usec = (value % 1000) * 1000;
		result = setsockopt(socket, SOL_SOCKET, SO_RCVTIMEO, (char*)&timeVal, sizeof(struct timeval));

		break;
	}

	case ENET_SOCKOPT_SNDTIMEO: {
		struct timeval timeVal;

		timeVal.tv_sec = value / 1000;
		timeVal.tv_usec = (value % 1000) * 1000;
		result = setsockopt(socket, SOL_SOCKET, SO_SNDTIMEO, (char*)&timeVal, sizeof(struct timeval));

		break;
	}

	case ENET_SOCKOPT_NODELAY:
		result = setsockopt(socket, IPPROTO_TCP, TCP_NODELAY, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_IPV6_V6ONLY:
		result = setsockopt(socket, IPPROTO_IPV6, IPV6_V6ONLY, (char*)&value, sizeof(int));

		break;

	default:
		break;
	}

	return result == -1 ? -1 : 0;
}